

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

bool __thiscall
BTree<StringBTree,_StringKey>::searchByIndex
          (BTree<StringBTree,_StringKey> *this,uint index,StringKey *key)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar2 = *(ushort *)(this->m_data + 4);
  puVar3 = this->m_data + 6;
  if (uVar2 != 0) {
    uVar5 = uVar2 << 8 | uVar2 >> 8;
    uVar2 = 1;
    if (1 < uVar5) {
      uVar2 = uVar5;
    }
    uVar6 = (uint)uVar2;
    uVar8 = index;
    do {
      uVar6 = uVar6 - 1;
      uVar2 = swap_bytes(*(undefined2 *)puVar3);
      uVar11 = uVar2 >> 4 & 0x7ff;
      uVar5 = swap_bytes(*(undefined2 *)(puVar3 + (uVar11 * 0xc + 0xc >> 3)));
      uVar10 = (ulong)(uVar5 >> ((byte)uVar2 >> 2 & 4) & 0xfff);
      uVar12 = uVar11;
      if (uVar8 < uVar11) {
        uVar12 = 0;
        uVar10 = 0;
      }
      puVar3 = puVar3 + uVar10;
      index = uVar8 - uVar12;
    } while ((uVar11 <= uVar8) && (uVar8 = index, uVar6 != 0));
  }
  uVar2 = swap_bytes(*(undefined2 *)(puVar3 + (index * 0xc + 0xc >> 3)));
  pbVar4 = puVar3 + (ulong)(uVar2 >> ((byte)(index << 2) & 4) & 0xfff) + 1;
  uVar10 = (ulong)pbVar4[-1];
  if ((char)pbVar4[-1] < '\0') {
    uVar9 = 0x80;
    do {
      uVar7 = (uVar10 - uVar9) * 0x100;
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      uVar10 = bVar1 | uVar7;
      uVar9 = uVar9 << 7;
    } while ((uVar7 & uVar9) != 0);
  }
  key->m_length = (uint)uVar10;
  key->m_value = (char *)pbVar4;
  return true;
}

Assistant:

bool searchByIndex(unsigned int index, Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);

			if (index < high)
				break;
			index -= high;

			p = advancePointer(p, nextOffset);
		}
		
		const auto offset = getBitsAt(p, index + 1);
		p = advancePointer(p, offset);
		
		return self.parseData(key, p) != nullptr;
	}